

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall
Search::predictor::add_allowed(predictor *this,v_array<std::pair<unsigned_int,_float>_> *a)

{
  v_array<float> *pvVar1;
  predictor *in_RSI;
  predictor *in_RDI;
  size_t i;
  bool clear_first;
  float a_00;
  v_array<float> *pvVar2;
  v_array<float> *A;
  
  pvVar2 = (v_array<float> *)0x0;
  while( true ) {
    A = pvVar2;
    pvVar1 = (v_array<float> *)
             v_array<std::pair<unsigned_int,_float>_>::size
                       ((v_array<std::pair<unsigned_int,_float>_> *)in_RSI);
    if (pvVar1 <= pvVar2) break;
    v_array<std::pair<unsigned_int,_float>_>::operator[]
              ((v_array<std::pair<unsigned_int,_float>_> *)in_RSI,(size_t)A);
    a_00 = (float)((ulong)pvVar2 >> 0x20);
    clear_first = SUB81((ulong)pvVar2 >> 0x18,0);
    add_to<unsigned_int>(in_RSI,(v_array<unsigned_int> *)A,&in_RDI->is_ldf,(uint)a_00,clear_first);
    v_array<std::pair<unsigned_int,_float>_>::operator[]
              ((v_array<std::pair<unsigned_int,_float>_> *)in_RSI,(size_t)A);
    add_to<float>(in_RSI,A,&in_RDI->is_ldf,a_00,clear_first);
    pvVar2 = (v_array<float> *)((long)&A->_begin + 1);
  }
  return in_RDI;
}

Assistant:

predictor& predictor::add_allowed(v_array<pair<action, float>>& a)
{
  for (size_t i = 0; i < a.size(); i++)
  {
    add_to(allowed_actions, allowed_is_pointer, a[i].first, false);
    add_to(allowed_actions_cost, allowed_cost_is_pointer, a[i].second, false);
  }
  return *this;
}